

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O1

void __thiscall Fl_Slider::draw_bg(Fl_Slider *this,int X,int Y,int W,int H)

{
  uchar uVar1;
  int iVar2;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])();
  Fl_Widget::draw_box((Fl_Widget *)this);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  iVar2 = Fl_Widget::active_r((Fl_Widget *)this);
  uVar1 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  if (uVar1 == '\x05') {
    Y = Y + H / 2 + -2;
    H = 4;
  }
  else {
    if (uVar1 != '\x04') {
      return;
    }
    X = X + W / 2 + -2;
    W = 4;
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,X,Y,W,H,(uint)(iVar2 == 0) << 3);
  return;
}

Assistant:

void Fl_Slider::draw_bg(int X, int Y, int W, int H) {
  fl_push_clip(X, Y, W, H);
  draw_box();
  fl_pop_clip();

  Fl_Color black = active_r() ? FL_FOREGROUND_COLOR : FL_INACTIVE_COLOR;
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(FL_THIN_DOWN_BOX, X+W/2-2, Y, 4, H, black);
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(FL_THIN_DOWN_BOX, X, Y+H/2-2, W, 4, black);
  }
}